

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_from_hex(char *hex,uint32_t flags,wally_tx **output)

{
  int iVar1;
  ulong uVar2;
  uchar *bytes_out;
  ulong size;
  size_t written;
  uchar buff [2048];
  size_t local_840;
  uchar local_838 [2056];
  
  if (hex == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = strlen(hex);
  }
  iVar1 = -2;
  if ((hex != (char *)0x0) && (output != (wally_tx **)0x0 && (uVar2 & 1) == 0)) {
    size = uVar2 >> 1;
    if (uVar2 < 0x1001) {
      bytes_out = local_838;
    }
    else {
      bytes_out = (uchar *)wally_malloc(size);
      if (bytes_out == (uchar *)0x0) {
        return -3;
      }
    }
    iVar1 = wally_hex_to_bytes(hex,bytes_out,size,&local_840);
    if (iVar1 == 0) {
      iVar1 = tx_from_bytes(bytes_out,size,flags,output);
    }
    if (bytes_out == local_838) {
      wally_clear(local_838,size);
    }
    else {
      clear_and_free(bytes_out,size);
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_from_hex(const char *hex, uint32_t flags,
                      struct wally_tx **output)
{
    unsigned char buff[TX_STACK_SIZE], *buff_p = buff;
    size_t hex_len = hex ? strlen(hex) : 0, bin_len;
    size_t written;
    int ret;

    if (!hex || hex_len & 0x1 || !output)
        return WALLY_EINVAL;

    bin_len = hex_len / 2;

    if (bin_len > sizeof(buff)) {
        if ((buff_p = wally_malloc(bin_len)) == NULL)
            return WALLY_ENOMEM;
    }
    ret = wally_hex_to_bytes(hex, buff_p, bin_len, &written);
    if (ret == WALLY_OK)
        ret = tx_from_bytes(buff_p, bin_len, flags, output);

    if (buff_p != buff)
        clear_and_free(buff_p, bin_len);
    else
        wally_clear(buff, bin_len);

    return ret;
}